

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::Clara::Detail::TokenStream::loadBuffer(TokenStream *this)

{
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *this_00;
  pointer *ppTVar1;
  Token *pTVar2;
  StringRef *pSVar3;
  ulong uVar4;
  StringRef *pSVar5;
  iterator iVar6;
  long lVar7;
  char *pcVar8;
  size_t pos;
  ulong uVar9;
  ulong uVar10;
  Token local_40;
  
  pTVar2 = (this->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar6._M_current =
       (this->m_tokenBuffer).
       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current != pTVar2) {
    (this->m_tokenBuffer).
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_finish = pTVar2;
    iVar6._M_current = pTVar2;
  }
  pSVar5 = (this->it)._M_current;
  pSVar3 = (this->itEnd)._M_current;
  if (pSVar5 == pSVar3) {
    return;
  }
  this_00 = &this->m_tokenBuffer;
  while (uVar4 = pSVar5->m_size, uVar4 == 0) {
    pSVar5 = pSVar5 + 1;
    (this->it)._M_current = pSVar5;
    if (pSVar5 == pSVar3) {
      return;
    }
  }
  pcVar8 = pSVar5->m_start;
  local_40.token.m_start = pcVar8;
  local_40.token.m_size = uVar4;
  if (*pcVar8 == '-') {
    uVar9 = 0;
    do {
      if (((ulong)(byte)pcVar8[uVar9] < 0x3e) &&
         ((0x2400000100000000U >> ((ulong)(byte)pcVar8[uVar9] & 0x3f) & 1) != 0)) {
        if (uVar9 != 0xffffffffffffffff) {
          local_40.type = Option;
          local_40.token.m_size = uVar9;
          if (uVar4 < uVar9) {
            local_40.token.m_size = uVar4;
          }
          if (iVar6._M_current ==
              (this->m_tokenBuffer).
              super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
            _M_realloc_insert<Catch::Clara::Detail::Token>(this_00,iVar6,&local_40);
            iVar6._M_current =
                 (this->m_tokenBuffer).
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            ((iVar6._M_current)->token).m_size = local_40.token.m_size;
            *(ulong *)iVar6._M_current = (ulong)(uint)local_40._4_4_ << 0x20;
            ((iVar6._M_current)->token).m_start = pcVar8;
            iVar6._M_current =
                 (this->m_tokenBuffer).
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->m_tokenBuffer).
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current;
          }
          uVar10 = ~uVar9 + uVar4;
          if (uVar4 <= ~uVar9 + uVar4) {
            uVar10 = uVar4;
          }
          local_40.token.m_start = "";
          if (uVar9 + 1 < uVar4) {
            local_40.token.m_start = pcVar8 + uVar9 + 1;
          }
          local_40.type = Argument;
          local_40.token.m_size = 0;
          if (uVar9 + 1 < uVar4) {
            local_40.token.m_size = uVar10;
          }
          goto LAB_00142eb3;
        }
        break;
      }
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
    if (2 < uVar4 && pcVar8[1] != '-') {
      lVar7 = uVar4 - 1;
      do {
        pcVar8 = pcVar8 + 1;
        local_40.type = Option;
        local_40.token.m_size = 1;
        iVar6._M_current =
             (this->m_tokenBuffer).
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->m_tokenBuffer).
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_40.token.m_start = pcVar8;
          std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
          _M_realloc_insert<Catch::Clara::Detail::Token>(this_00,iVar6,&local_40);
        }
        else {
          ((iVar6._M_current)->token).m_size = 1;
          *(ulong *)iVar6._M_current = (ulong)(uint)local_40._4_4_ << 0x20;
          ((iVar6._M_current)->token).m_start = pcVar8;
          ppTVar1 = &(this->m_tokenBuffer).
                     super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      return;
    }
    local_40.type = Option;
  }
  else {
    local_40.type = Argument;
  }
LAB_00142eb3:
  if (iVar6._M_current ==
      (this->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
    _M_realloc_insert<Catch::Clara::Detail::Token>(this_00,iVar6,&local_40);
  }
  else {
    ((iVar6._M_current)->token).m_size = local_40.token.m_size;
    *(ulong *)iVar6._M_current = CONCAT44(local_40._4_4_,local_40.type);
    ((iVar6._M_current)->token).m_start = local_40.token.m_start;
    ppTVar1 = &(this->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return;
}

Assistant:

void TokenStream::loadBuffer() {
                m_tokenBuffer.clear();

                // Skip any empty strings
                while ( it != itEnd && it->empty() ) {
                    ++it;
                }

                if ( it != itEnd ) {
                    StringRef next = *it;
                    if ( isOptPrefix( next[0] ) ) {
                        auto delimiterPos = find_first_separator(next);
                        if ( delimiterPos != StringRef::npos ) {
                            m_tokenBuffer.push_back(
                                { TokenType::Option,
                                  next.substr( 0, delimiterPos ) } );
                            m_tokenBuffer.push_back(
                                { TokenType::Argument,
                                  next.substr( delimiterPos + 1, next.size() ) } );
                        } else {
                            if ( next[1] != '-' && next.size() > 2 ) {
                                // Combined short args, e.g. "-ab" for "-a -b"
                                for ( size_t i = 1; i < next.size(); ++i ) {
                                    m_tokenBuffer.push_back(
                                        { TokenType::Option,
                                          next.substr( i, 1 ) } );
                                }
                            } else {
                                m_tokenBuffer.push_back(
                                    { TokenType::Option, next } );
                            }
                        }
                    } else {
                        m_tokenBuffer.push_back(
                            { TokenType::Argument, next } );
                    }
                }
            }